

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traversal_algorithm.cpp
# Opt level: O2

bool __thiscall libtorrent::dht::traversal_algorithm::add_requests(traversal_algorithm *this)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  __shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  observer *this_00;
  dht_observer *pdVar6;
  pointer psVar7;
  _Alloc_hider _Var8;
  _Alloc_hider _Var9;
  bool bVar10;
  int iVar11;
  int iVar12;
  undefined7 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined1 uVar13;
  ulong uVar14;
  undefined7 uVar15;
  address *addr;
  int iVar16;
  uint uVar17;
  __shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2> *p_Var18;
  long lVar19;
  span<const_char> in;
  __shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2> local_a0;
  string local_90;
  string local_70;
  aux local_50 [32];
  
  bVar10 = true;
  if (this->m_done == false) {
    iVar16 = (this->m_node->m_table).m_bucket_size;
    bVar10 = aux::session_settings::get_bool(this->m_node->m_settings,0x8049);
    uVar14 = CONCAT71(extraout_var,bVar10) & 0xffffffff;
    p_Var18 = &((this->m_results).
                super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>;
    p_Var5 = &((this->m_results).
               super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>;
    lVar19 = -(long)p_Var18;
    uVar17 = 0;
    uVar13 = (undefined1)uVar14;
    while ((bVar10 = true, p_Var18 != p_Var5 && (0 < iVar16))) {
      if ((char)uVar14 == '\0') {
        if (this->m_branch_factor <= this->m_invoke_count) goto LAB_0036ffd1;
      }
      else if ((int)this->m_branch_factor <= (int)uVar17) goto LAB_0036ffd1;
      this_00 = p_Var18->_M_ptr;
      bVar1 = (this_00->flags).m_val;
      if ((bVar1 & 0x40) == 0) {
        if ((bVar1 & 1) == 0) {
          pdVar6 = this->m_node->m_observer;
          if (pdVar6 != (dht_observer *)0x0) {
            iVar11 = (**(pdVar6->super_dht_logger)._vptr_dht_logger)(pdVar6,4);
            uVar14 = CONCAT71((int7)(uVar14 >> 8),uVar13);
            if ((char)iVar11 != '\0') {
              uVar4 = this->m_id;
              psVar7 = (this->m_results).
                       super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              cVar2 = this->m_invoke_count;
              cVar3 = this->m_branch_factor;
              iVar11 = distance_exp(&this->m_target,&this_00->m_id);
              in.m_len = uVar14;
              in.m_ptr = (char *)0x14;
              aux::to_hex_abi_cxx11_(&local_70,(aux *)&this_00->m_id,in);
              _Var9._M_p = local_70._M_dataplus._M_p;
              observer::target_addr(this_00);
              aux::print_address_abi_cxx11_(&local_90,local_50,addr);
              _Var8._M_p = local_90._M_dataplus._M_p;
              iVar12 = (*this->_vptr_traversal_algorithm[2])(this);
              uVar14 = (ulong)uVar4;
              (*(pdVar6->super_dht_logger)._vptr_dht_logger[1])
                        (pdVar6,4,
                         "[%u] INVOKE nodes-left: %d top-invoke-count: %d invoke-count: %d branch-factor: %d distance: %d id: %s addr: %s type: %s"
                         ,uVar14,(ulong)((long)&(psVar7->
                                                super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr + lVar19) >> 4 & 0xffffffff,(ulong)uVar17,
                         (ulong)(uint)(int)cVar2,(ulong)(uint)(int)cVar3,
                         CONCAT44(extraout_var_00,iVar11),_Var9._M_p,_Var8._M_p,
                         CONCAT44(extraout_var_01,iVar12));
              ::std::__cxx11::string::~string((string *)&local_90);
              ::std::__cxx11::string::~string((string *)&local_70);
              uVar14 = CONCAT71((int7)(uVar14 >> 8),uVar13);
            }
          }
          if (this->m_abort == false) {
            (this_00->flags).m_val = (this_00->flags).m_val | 1;
            ::std::__shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_a0,p_Var18);
            iVar11 = (*this->_vptr_traversal_algorithm[6])(this,&local_a0);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_a0._M_refcount);
            uVar15 = (undefined7)(uVar14 >> 8);
            if ((char)iVar11 == '\0') {
              (this_00->flags).m_val = (this_00->flags).m_val | 0x10;
              uVar14 = CONCAT71(uVar15,uVar13);
            }
            else {
              this->m_invoke_count = this->m_invoke_count + '\x01';
              uVar17 = uVar17 + 1;
              uVar14 = CONCAT71(uVar15,uVar13);
            }
          }
        }
        else {
          uVar17 = uVar17 + ((bVar1 & 0x10) == 0);
        }
      }
      else {
        iVar16 = iVar16 + -1;
      }
      p_Var18 = p_Var18 + 1;
      lVar19 = lVar19 + -0x10;
    }
    if (iVar16 != 0 || uVar17 != 0) {
LAB_0036ffd1:
      bVar10 = this->m_invoke_count == '\0';
    }
  }
  return bVar10;
}

Assistant:

bool traversal_algorithm::add_requests()
{
	INVARIANT_CHECK;
	if (m_done) return true;

	int results_target = m_node.m_table.bucket_size();

	// this only counts outstanding requests at the top of the
	// target list. This is <= m_invoke count. m_invoke_count
	// is the total number of outstanding requests, including
	// old ones that may be waiting on nodes much farther behind
	// the current point we've reached in the search.
	int outstanding = 0;

	// if we're doing aggressive lookups, we keep branch-factor
	// outstanding requests _at the tops_ of the result list. Otherwise
	// we just keep any branch-factor outstanding requests
	bool const agg = m_node.settings().get_bool(settings_pack::dht_aggressive_lookups);

	// Find the first node that hasn't already been queried.
	// and make sure that the 'm_branch_factor' top nodes
	// stay queried at all times (obviously ignoring failed nodes)
	// and without surpassing the 'result_target' nodes (i.e. k=8)
	// this is a slight variation of the original paper which instead
	// limits the number of outstanding requests, this limits the
	// number of good outstanding requests. It will use more traffic,
	// but is intended to speed up lookups
	for (auto i = m_results.begin()
		, end(m_results.end()); i != end
		&& results_target > 0
		&& (agg ? outstanding < m_branch_factor
			: m_invoke_count < m_branch_factor);
		++i)
	{
		observer* o = i->get();
		if (o->flags & observer::flag_alive)
		{
			TORRENT_ASSERT(o->flags & observer::flag_queried);
			--results_target;
			continue;
		}
		if (o->flags & observer::flag_queried)
		{
			// if it's queried, not alive and not failed, it
			// must be currently in flight
			if (!(o->flags & observer::flag_failed))
				++outstanding;

			continue;
		}

#ifndef TORRENT_DISABLE_LOGGING
		dht_observer* logger = get_node().observer();
		if (logger != nullptr && logger->should_log(dht_logger::traversal))
		{
			logger->log(dht_logger::traversal
				, "[%u] INVOKE nodes-left: %d top-invoke-count: %d "
				"invoke-count: %d branch-factor: %d "
				"distance: %d id: %s addr: %s type: %s"
				, m_id, int(m_results.end() - i), outstanding, int(m_invoke_count)
				, int(m_branch_factor), distance_exp(m_target, o->id()), aux::to_hex(o->id()).c_str()
				, aux::print_address(o->target_addr()).c_str(), name());
		}
#endif

		// we're shutting down, don't issue any more lookups
		if (m_abort) continue;

		TORRENT_ASSERT(!(o->flags & observer::flag_queried));
		o->flags |= observer::flag_queried;
		if (invoke(*i))
		{
			TORRENT_ASSERT(m_invoke_count < std::numeric_limits<std::int8_t>::max());
			++m_invoke_count;
			++outstanding;
		}
		else
		{
			o->flags |= observer::flag_failed;
		}
	}

	// this is the completion condition. If we found m_node.m_table.bucket_size()
	// (i.e. k=8) completed results, without finding any still
	// outstanding requests, we're done.
	// also, if invoke count is 0, it means we didn't even find 'k'
	// working nodes, we still have to terminate though.
	return (results_target == 0 && outstanding == 0) || m_invoke_count == 0;
}